

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

string * __thiscall
toml::format<char_const*,char_const(&)[15]>
          (string *__return_storage_ptr__,toml *this,stringstream *ss,char **t,char (*args) [15])

{
  char (*t_00) [15];
  
  t_00 = (char (*) [15])t;
  std::operator<<((ostream *)(this + 0x10),*(char **)ss);
  format<char_const(&)[15]>(__return_storage_ptr__,this,(stringstream *)t,t_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}